

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int enter_frame(flatcc_builder_t *B,uint16_t align)

{
  undefined1 auVar1 [16];
  int iVar2;
  flatbuffers_uoffset_t fVar3;
  __flatcc_builder_frame_t *p_Var4;
  uint16_t align_local;
  flatcc_builder_t *B_local;
  
  iVar2 = B->level + 1;
  B->level = iVar2;
  if (B->limit_level < iVar2) {
    if ((0 < B->max_level) && (B->max_level < B->level)) {
      return -1;
    }
    p_Var4 = (__flatcc_builder_frame_t *)reserve_buffer(B,4,(long)(B->level + -1) * 0x24,0x24,0);
    B->frame = p_Var4;
    if (p_Var4 == (__flatcc_builder_frame_t *)0x0) {
      return -1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = B->buffers[4].iov_len;
    B->limit_level = SUB164(auVar1 / ZEXT816(0x24),0);
    if ((0 < B->max_level) && (B->max_level < B->limit_level)) {
      B->limit_level = B->max_level;
    }
  }
  else {
    B->frame = B->frame + 1;
  }
  B->frame->ds_offset = B->ds_offset;
  B->frame->align = B->align;
  B->align = align;
  B->frame->ds_first = B->ds_first;
  B->frame->type_limit = 0xfffffffc;
  fVar3 = alignup_uoffset(B->ds_first + B->ds_offset,8);
  B->ds_first = fVar3;
  B->ds_offset = 0;
  return 0;
}

Assistant:

static int enter_frame(flatcc_builder_t *B, uint16_t align)
{
    if (++B->level > B->limit_level) {
        if (B->max_level > 0 && B->level > B->max_level) {
            return -1;
        }
        if (!(B->frame = reserve_buffer(B, flatcc_builder_alloc_fs,
                        (size_t)(B->level - 1) * frame_size, frame_size, 0))) {
            return -1;
        }
        B->limit_level = (int)(B->buffers[flatcc_builder_alloc_fs].iov_len / frame_size);
        if (B->max_level > 0 && B->max_level < B->limit_level) {
            B->limit_level = B->max_level;
        }
    } else {
        ++B->frame;
    }
    frame(ds_offset) = B->ds_offset;
    frame(align) = B->align;
    B->align = align;
    /* Note: do not assume padding before first has been allocated! */
    frame(ds_first) = B->ds_first;
    frame(type_limit) = data_limit;
    B->ds_first = alignup_uoffset(B->ds_first + B->ds_offset, 8);
    B->ds_offset = 0;
    return 0;
}